

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

int weapon_lookup(char *name)

{
  pointer pwVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  pointer pwVar6;
  pointer pwVar7;
  
  pwVar1 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = (lVar4 >> 3) * -0x5555555555555555 >> 2;
  pwVar6 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    pwVar6 = weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
    do {
      pwVar7 = pwVar6;
      if ((pwVar7[-2].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar7[-2].name), !bVar2)) {
        pwVar7 = pwVar7 + -2;
        goto LAB_0029bd69;
      }
      if ((pwVar7[-1].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar7[-1].name), !bVar2)) {
        pwVar7 = pwVar7 + -1;
        goto LAB_0029bd69;
      }
      if ((pwVar7->name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar7->name), !bVar2))
      goto LAB_0029bd69;
      if ((pwVar7[1].name != (char *)0x0) && (bVar2 = str_prefix(name,pwVar7[1].name), !bVar2)) {
        pwVar7 = pwVar7 + 1;
        goto LAB_0029bd69;
      }
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + -0x60;
      pwVar6 = pwVar7 + 4;
    } while (1 < lVar5);
    pwVar6 = pwVar7 + 2;
  }
  lVar4 = (lVar4 >> 3) * -0x5555555555555555;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pwVar7 = pwVar1;
      if ((lVar4 != 3) ||
         ((pwVar6->name != (char *)0x0 &&
          (bVar2 = str_prefix(name,pwVar6->name), pwVar7 = pwVar6, !bVar2)))) goto LAB_0029bd69;
      pwVar6 = pwVar6 + 1;
    }
    if ((pwVar6->name != (char *)0x0) &&
       (bVar2 = str_prefix(name,pwVar6->name), pwVar7 = pwVar6, !bVar2)) goto LAB_0029bd69;
    pwVar6 = pwVar6 + 1;
  }
  if ((pwVar6->name == (char *)0x0) ||
     (bVar2 = str_prefix(name,pwVar6->name), pwVar7 = pwVar6, bVar2)) {
    pwVar7 = pwVar1;
  }
LAB_0029bd69:
  if (pwVar7 == weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)((ulong)((long)pwVar7 -
                         (long)weapon_table.
                               super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  }
  return iVar3;
}

Assistant:

int weapon_lookup(const char *name)
{
	auto it = std::find_if(weapon_table.begin(), weapon_table.end(), [name] (auto weapon) {
		return weapon.name != nullptr && !str_prefix(name, weapon.name);
	});

	return it != weapon_table.end()
		? it - weapon_table.begin()
		: -1;
}